

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  bool bVar1;
  InstanceSymbol *this_00;
  unsigned_long *puVar2;
  size_t sVar3;
  CompilationOptions *pCVar4;
  Scope *pSVar5;
  Diagnostic *pDVar6;
  Definition *this_01;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar7;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>::templated_iterator<const_slang::ast::InstanceBodySymbol_*>,_bool>
  pVar8;
  string_view arg;
  Diagnostic *diag;
  InstanceSymbol *local_120;
  undefined1 local_118 [8];
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_ElabVisitors_h:269:33)>
  guard;
  InstanceBodySymbol *local_c0;
  EntryPointer local_b8;
  byte local_b0;
  anon_class_8_1_8991fb9c local_a8;
  function_ref<void_(const_slang::ast::PortConnection_&)> local_a0;
  AttributeSymbol *local_90;
  AttributeSymbol *attr;
  iterator __end2;
  iterator __begin2;
  size_type local_70;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *local_68;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range2;
  Definition *local_50;
  anon_class_8_1_6c3d66d6 local_48;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_40;
  string_view local_30;
  TimeTraceScope local_19;
  InstanceSymbol *pIStack_18;
  TimeTraceScope timeScope;
  InstanceSymbol *symbol_local;
  DiagnosticVisitor *this_local;
  
  if ((*this->numErrors <= (ulong)this->errorLimit) && ((this->hierarchyProblem & 1U) == 0)) {
    pIStack_18 = symbol;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"AST Instance");
    local_48.symbol = pIStack_18;
    function_ref<std::__cxx11::string()>::
    function_ref<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda()_1_>
              ((function_ref<std::__cxx11::string()> *)&local_40,&local_48,
               (enable_if_t<_std::is_same<std::remove_cv_t<std::remove_reference_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_ElabVisitors_h:239:50)>_>,_function_ref<basic_string<char>_()>_>::value>
                *)0x0);
    TimeTraceScope::TimeTraceScope(&local_19,local_30,local_40);
    local_50 = InstanceSymbol::getDefinition(pIStack_18);
    puVar2 = ska::
             flat_hash_map<const_slang::ast::Definition_*,_unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>,_std::equal_to<const_slang::ast::Definition_*>,_std::allocator<std::pair<const_slang::ast::Definition_*,_unsigned_long>_>_>
             ::operator[](&this->instanceCount,&local_50);
    *puVar2 = *puVar2 + 1;
    sVar7 = Compilation::getAttributes(this->compilation,(Symbol *)pIStack_18);
    local_70 = sVar7.size_;
    __begin2 = sVar7.data_;
    local_68 = (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)&__begin2;
    __end2 = nonstd::span_lite::
             span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin(local_68)
    ;
    attr = (AttributeSymbol *)
           nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>
           ::end(local_68);
    for (; this_00 = pIStack_18, (AttributeSymbol *)__end2 != attr; __end2 = __end2 + 1) {
      local_90 = *__end2;
      AttributeSymbol::getValue(local_90);
    }
    local_a8.this = this;
    function_ref<void(slang::ast::PortConnection_const&)>::
    function_ref<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda(auto:1&)_1_>
              ((function_ref<void(slang::ast::PortConnection_const&)> *)&local_a0,&local_a8,
               (enable_if_t<_std::is_same<std::remove_cv_t<std::remove_reference_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_ElabVisitors_h:250:38)>_>,_function_ref<void_(const_PortConnection_&)>_>::value>
                *)0x0);
    InstanceSymbol::forEachPortConnection(this_00,local_a0);
    local_c0 = pIStack_18->body;
    pVar8 = ska::
            flat_hash_set<const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
            ::emplace(&this->activeInstanceBodies,&local_c0);
    local_b8 = (EntryPointer)pVar8.first.current;
    local_b0 = pVar8.second;
    if (((local_b0 ^ 0xff) & 1) == 0) {
      local_120 = pIStack_18;
      diag = (Diagnostic *)this;
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/ElabVisitors.h:269:33)>
      ::ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_ElabVisitors_h:269:33)>
                    *)local_118,(anon_class_16_2_53f44593_for_func *)&diag);
      sVar3 = ska::detailv3::
              sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
              ::size(&(this->activeInstanceBodies).
                      super_sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
                    );
      pCVar4 = Compilation::getOptions(this->compilation);
      bVar1 = sVar3 <= pCVar4->maxInstanceDepth;
      if (bVar1) {
        ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false>::
        visit<slang::ast::InstanceBodySymbol>
                  ((ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false> *)this,pIStack_18->body)
        ;
      }
      else {
        pSVar5 = Symbol::getParentScope((Symbol *)pIStack_18);
        pDVar6 = Scope::addDiag(pSVar5,(DiagCode)0xc000d,
                                (pIStack_18->super_InstanceSymbolBase).super_Symbol.location);
        this_01 = InstanceSymbol::getDefinition(pIStack_18);
        arg = Definition::getKindString(this_01);
        Diagnostic::operator<<(pDVar6,arg);
        pCVar4 = Compilation::getOptions(this->compilation);
        Diagnostic::operator<<(pDVar6,pCVar4->maxInstanceDepth);
        this->hierarchyProblem = true;
      }
      guard._21_3_ = 0;
      guard._20_1_ = !bVar1;
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/ElabVisitors.h:269:33)>
      ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_ElabVisitors_h:269:33)>
                     *)local_118);
    }
    else {
      pSVar5 = Symbol::getParentScope((Symbol *)pIStack_18);
      pDVar6 = Scope::addDiag(pSVar5,(DiagCode)0x8000d,
                              (pIStack_18->super_InstanceSymbolBase).super_Symbol.location);
      Diagnostic::operator<<(pDVar6,(pIStack_18->super_InstanceSymbolBase).super_Symbol.name);
      this->hierarchyProblem = true;
      guard._20_4_ = 1;
    }
    TimeTraceScope::~TimeTraceScope(&local_19);
  }
  return;
}

Assistant:

void handle(const InstanceSymbol& symbol) {
        if (numErrors > errorLimit || hierarchyProblem)
            return;

        TimeTraceScope timeScope("AST Instance", [&] {
            std::string buffer;
            symbol.getHierarchicalPath(buffer);
            return buffer;
        });

        instanceCount[&symbol.getDefinition()]++;

        for (auto attr : compilation.getAttributes(symbol))
            attr->getValue();

        symbol.forEachPortConnection([&](auto& conn) {
            conn.getExpression();
            conn.checkSimulatedNetTypes();
            for (auto attr : compilation.getAttributes(conn))
                attr->getValue();
        });

        // Detect infinite recursion, which happens if we see this exact
        // instance body somewhere higher up in the stack.
        if (!activeInstanceBodies.emplace(&symbol.body).second) {
            symbol.getParentScope()->addDiag(diag::InfinitelyRecursiveHierarchy, symbol.location)
                << symbol.name;
            hierarchyProblem = true;
            return;
        }

        // In order to avoid "effectively infinite" recursions, where parameter values
        // are changing but the numbers are so huge that we would run for almost forever,
        // check the depth and bail out after a certain configurable point.
        auto guard = ScopeGuard([this, &symbol] { activeInstanceBodies.erase(&symbol.body); });
        if (activeInstanceBodies.size() > compilation.getOptions().maxInstanceDepth) {
            auto& diag = symbol.getParentScope()->addDiag(diag::MaxInstanceDepthExceeded,
                                                          symbol.location);
            diag << symbol.getDefinition().getKindString();
            diag << compilation.getOptions().maxInstanceDepth;
            hierarchyProblem = true;
            return;
        }

        visit(symbol.body);
    }